

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

nullable_omittable_field<int> * __thiscall
discordpp::nullable_omittable_field<int>::operator=(nullable_omittable_field<int> *this)

{
  nullable_omittable_field<int> *this_local;
  
  std::unique_ptr<int,_std::default_delete<int>_>::operator=
            (&(this->super_field<int>).t_,(nullptr_t)0x0);
  (this->super_field<int>).s_ = nulled_e;
  return this;
}

Assistant:

virtual nullable_omittable_field &operator=(nulled_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::nulled_e;
        return *this;
    }